

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O2

void es::init::report_singletons_stack(void)

{
  ostream *poVar1;
  sequenced_ptr<es::init::singletons_meta_data> *md;
  
  md = &static_obj_stack<es::init::singletons_meta_data>::top;
  while (md = (sequenced_ptr<es::init::singletons_meta_data> *)((singletons_meta_data *)md)->_next,
        (singletons_meta_data *)md != (singletons_meta_data *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"singletons_stack_meta_data_node[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,"]: ");
    poVar1 = operator<<(poVar1,(singletons_meta_data *)md);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

inline void report_singletons_stack()
{
    uint64_t n{0};
    for (singletons_meta_data* p = stack::top._u._s._p; p != nullptr; p = p->_next)
    {
        std::cout << "singletons_stack_meta_data_node[" << n << "]: " << *p << std::endl;
        ++n;
    }
}